

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenTypeExpand(BinaryenType t,BinaryenType *buf)

{
  Type *pTVar1;
  Type *pTVar2;
  Type local_40;
  Type types;
  Iterator __begin1;
  
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_40.id = t;
  types.id = (uintptr_t)&local_40;
  pTVar1 = (Type *)wasm::Type::size(&local_40);
  if (pTVar1 != (Type *)0x0) {
    do {
      do {
        pTVar2 = wasm::Type::Iterator::operator*((Iterator *)&types);
        *buf = pTVar2->id;
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
        buf = buf + 1;
      } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
               != pTVar1);
    } while ((Type *)types.id != &local_40);
  }
  return;
}

Assistant:

void BinaryenTypeExpand(BinaryenType t, BinaryenType* buf) {
  Type types(t);
  size_t i = 0;
  for (const auto& type : types) {
    buf[i++] = type.getID();
  }
}